

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O3

string * __thiscall
TCLAP::ArgException::argId_abi_cxx11_(string *__return_storage_ptr__,ArgException *this)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)&this->_argId);
  if (iVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__," ","");
  }
  else {
    std::operator+(__return_storage_ptr__,"Argument: ",&this->_argId);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string argId() const  
		{ 
			if ( _argId == "undefined" )
				return " ";
			else
				return ( "Argument: " + _argId ); 
		}